

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.cpp
# Opt level: O2

void __thiscall chatter::Protocol::calculate_rtt(Protocol *this,Peer *peer,uint64_t measurement)

{
  uint64_t uVar1;
  long lVar2;
  float fVar3;
  float fVar4;
  
  if (peer != (Peer *)0x0) {
    fVar3 = (float)(measurement - peer->m_rtt_avg);
    fVar4 = fVar3 * 0.125;
    lVar2 = (long)fVar4;
    peer->m_rtt_avg =
         ((ushort)lVar2 | (ushort)(long)(fVar4 - 9.223372e+18) & (ushort)(lVar2 >> 0x3f)) +
         peer->m_rtt_avg;
    fVar3 = (fVar3 - (float)peer->m_rtt_dev) * 0.25;
    lVar2 = (long)fVar3;
    peer->m_rtt_dev =
         ((ushort)lVar2 | (ushort)(long)(fVar3 - 9.223372e+18) & (ushort)(lVar2 >> 0x3f)) +
         peer->m_rtt_dev;
    uVar1 = Host::timestamp_now(this->m_host);
    peer->m_last_rtt_ts = uVar1;
  }
  return;
}

Assistant:

void Protocol::calculate_rtt(Peer* peer, uint64_t measurement)
{
    static const float avg_gain = 0.125;
    static const float dev_gain = 0.25;

    if (!peer)
        return;

    float error = measurement - peer->m_rtt_avg;

    peer->m_rtt_avg += static_cast<uint64_t>(avg_gain * error);
    peer->m_rtt_dev += static_cast<uint64_t>(dev_gain * (std::abs(error) - peer->m_rtt_dev));
    peer->m_last_rtt_ts = m_host->timestamp_now();
}